

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_serializer.cpp
# Opt level: O0

void __thiscall Serializer_Normal_Test::TestBody(Serializer_Normal_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_2d0;
  Message local_2c8;
  ByteData local_2c0;
  string local_2a8;
  ByteData local_288;
  string local_270;
  undefined1 local_250 [8];
  AssertionResult gtest_ar_2;
  Message local_238;
  ByteData local_230;
  string local_218;
  ByteData local_1f8;
  string local_1e0;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_1;
  Serializer obj2;
  Serializer obj;
  Message local_158;
  ByteData local_150;
  string local_138;
  undefined1 local_118 [8];
  AssertionResult gtest_ar;
  string local_100;
  ByteData local_e0;
  allocator local_c1;
  string local_c0;
  ByteData local_a0;
  allocator local_81;
  string local_80;
  ByteData local_60;
  undefined1 local_38 [8];
  Serializer builder;
  Serializer_Normal_Test *this_local;
  
  builder._32_8_ = this;
  cfd::core::Serializer::Serializer((Serializer *)local_38);
  cfd::core::Serializer::AddDirectNumber((Serializer *)local_38,1);
  cfd::core::Serializer::AddDirectNumber((Serializer *)local_38,2);
  cfd::core::Serializer::AddDirectByte((Serializer *)local_38,'\x03');
  cfd::core::Serializer::AddVariableInt((Serializer *)local_38,0x1ffff);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"f1f2",&local_81);
  cfd::core::ByteData::ByteData(&local_60,&local_80);
  cfd::core::Serializer::AddVariableBuffer((Serializer *)local_38,&local_60);
  cfd::core::ByteData::~ByteData(&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"d1d2d3d4",&local_c1);
  cfd::core::ByteData::ByteData(&local_a0,&local_c0);
  cfd::core::Serializer::AddPrefixBuffer((Serializer *)local_38,0xe1e2e3e4,&local_a0);
  cfd::core::ByteData::~ByteData(&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_100,"c1c2c3c4",(allocator *)((long)&gtest_ar.message_.ptr_ + 7));
  cfd::core::ByteData::ByteData(&local_e0,&local_100);
  cfd::core::Serializer::AddDirectBytes((Serializer *)local_38,&local_e0);
  cfd::core::ByteData::~ByteData(&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  cfd::core::Serializer::Output(&local_150,(Serializer *)local_38);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_138,&local_150);
  testing::internal::EqHelper<false>::Compare<char[71],std::__cxx11::string>
            ((EqHelper<false> *)local_118,
             "\"01000000020000000000000003feffff010002f1f209fee4e3e2e1d1d2d3d4c1c2c3c4\"",
             "builder.Output().GetHex()",
             (char (*) [71])"01000000020000000000000003feffff010002f1f209fee4e3e2e1d1d2d3d4c1c2c3c4"
             ,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  cfd::core::ByteData::~ByteData(&local_150);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&obj.offset_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_serializer.cpp"
               ,0x18,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&obj.offset_,&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&obj.offset_);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  cfd::core::Serializer::Serializer((Serializer *)&obj2.offset_,(Serializer *)local_38);
  cfd::core::Serializer::Serializer((Serializer *)&gtest_ar_1.message_);
  cfd::core::Serializer::operator=((Serializer *)&gtest_ar_1.message_,(Serializer *)local_38);
  cfd::core::Serializer::Output(&local_1f8,(Serializer *)local_38);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_1e0,&local_1f8);
  cfd::core::Serializer::Output(&local_230,(Serializer *)&obj2.offset_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_218,&local_230);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_1c0,"builder.Output().GetHex()","obj.Output().GetHex()",
             &local_1e0,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  cfd::core::ByteData::~ByteData(&local_230);
  std::__cxx11::string::~string((string *)&local_1e0);
  cfd::core::ByteData::~ByteData(&local_1f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(&local_238);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_serializer.cpp"
               ,0x1d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  cfd::core::Serializer::Output(&local_288,(Serializer *)local_38);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_270,&local_288);
  cfd::core::Serializer::Output(&local_2c0,(Serializer *)&gtest_ar_1.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_2a8,&local_2c0);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_250,"builder.Output().GetHex()","obj2.Output().GetHex()",
             &local_270,&local_2a8);
  std::__cxx11::string::~string((string *)&local_2a8);
  cfd::core::ByteData::~ByteData(&local_2c0);
  std::__cxx11::string::~string((string *)&local_270);
  cfd::core::ByteData::~ByteData(&local_288);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
  if (!bVar1) {
    testing::Message::Message(&local_2c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_250);
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_serializer.cpp"
               ,0x1e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    testing::Message::~Message(&local_2c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
  cfd::core::Serializer::~Serializer((Serializer *)&gtest_ar_1.message_);
  cfd::core::Serializer::~Serializer((Serializer *)&obj2.offset_);
  cfd::core::Serializer::~Serializer((Serializer *)local_38);
  return;
}

Assistant:

TEST(Serializer, Normal) {
  Serializer builder;
  builder.AddDirectNumber(uint32_t{1});
  builder.AddDirectNumber(uint64_t{2});
  builder.AddDirectByte(3);
  builder.AddVariableInt(0x01ffff);
  builder.AddVariableBuffer(ByteData("f1f2"));
  builder.AddPrefixBuffer(0xe1e2e3e4, ByteData("d1d2d3d4"));
  builder.AddDirectBytes(ByteData("c1c2c3c4"));

  EXPECT_EQ("01000000020000000000000003feffff010002f1f209fee4e3e2e1d1d2d3d4c1c2c3c4",
      builder.Output().GetHex());

  Serializer obj(builder);
  Serializer obj2;
  obj2 = builder;
  EXPECT_EQ(builder.Output().GetHex(), obj.Output().GetHex());
  EXPECT_EQ(builder.Output().GetHex(), obj2.Output().GetHex());
}